

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

int check_memory(unsigned_long value,unsigned_long check_value_data)

{
  int iVar1;
  char *in_RSI;
  char *in_RDI;
  CheckMemoryData *check;
  
  _assert_true((unsigned_long)check,in_RDI,in_RSI,(int)((ulong)in_RSI >> 0x20));
  iVar1 = memory_equal_display_error((char *)check_value_data,(char *)check,(size_t)in_RDI);
  return iVar1;
}

Assistant:

static int check_memory(const LargestIntegralType value,
                        const LargestIntegralType check_value_data) {
    CheckMemoryData * const check = cast_largest_integral_type_to_pointer(
        CheckMemoryData*, check_value_data);
    assert_non_null(check);
    return memory_equal_display_error(
        cast_largest_integral_type_to_pointer(const char*, value),
        (const char*)check->memory, check->size);
}